

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O3

uint8_t * __thiscall
CoreML::Specification::TreeEnsembleClassifier::_InternalSerialize
          (TreeEnsembleClassifier *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  StringVector *this_00;
  Int64Vector *this_01;
  void *data;
  bool bVar1;
  uint32_t uVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  int size;
  ulong uVar6;
  uint8_t *puVar7;
  size_t __n;
  TreeEnsembleParameters *this_02;
  
  this_02 = this->treeensemble_;
  if (this_02 != (TreeEnsembleParameters *)0x0 &&
      this != (TreeEnsembleClassifier *)_TreeEnsembleClassifier_default_instance_) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      this_02 = this->treeensemble_;
    }
    *target = '\n';
    uVar4 = (this_02->_cached_size_).size_.super___atomic_base<int>._M_i;
    target[1] = (uint8_t)uVar4;
    if (uVar4 < 0x80) {
      puVar7 = target + 2;
    }
    else {
      puVar7 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper
                         (uVar4,target + 1);
    }
    target = TreeEnsembleParameters::_InternalSerialize(this_02,puVar7,stream);
  }
  uVar4 = this->postevaluationtransform_;
  puVar7 = target;
  if (uVar4 != 0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      uVar4 = this->postevaluationtransform_;
    }
    *target = '\x10';
    target[1] = (byte)uVar4;
    if (uVar4 < 0x80) {
      puVar7 = target + 2;
    }
    else {
      target[1] = (byte)uVar4 | 0x80;
      target[2] = (uint8_t)((ulong)(long)(int)uVar4 >> 7);
      puVar7 = target + 3;
      if (0x3fff < uVar4) {
        uVar6 = (ulong)target[2];
        uVar3 = (ulong)(long)(int)uVar4 >> 7;
        do {
          puVar7[-1] = (byte)uVar6 | 0x80;
          uVar5 = uVar3 >> 7;
          *puVar7 = (uint8_t)uVar5;
          puVar7 = puVar7 + 1;
          uVar6 = uVar5 & 0xffffffff;
          bVar1 = 0x3fff < uVar3;
          uVar3 = uVar5;
        } while (bVar1);
      }
    }
  }
  uVar2 = this->_oneof_case_[0];
  if (uVar2 == 100) {
    if (stream->end_ <= puVar7) {
      puVar7 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar7);
    }
    this_00 = (this->ClassLabels_).stringclasslabels_;
    puVar7[0] = 0xa2;
    puVar7[1] = '\x06';
    uVar4 = (this_00->_cached_size_).size_.super___atomic_base<int>._M_i;
    puVar7[2] = (uint8_t)uVar4;
    if (uVar4 < 0x80) {
      puVar7 = puVar7 + 3;
    }
    else {
      puVar7 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper
                         (uVar4,puVar7 + 2);
    }
    puVar7 = StringVector::_InternalSerialize(this_00,puVar7,stream);
    uVar2 = this->_oneof_case_[0];
  }
  if (uVar2 == 0x65) {
    if (stream->end_ <= puVar7) {
      puVar7 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,puVar7);
    }
    this_01 = (this->ClassLabels_).int64classlabels_;
    puVar7[0] = 0xaa;
    puVar7[1] = '\x06';
    uVar4 = (this_01->_cached_size_).size_.super___atomic_base<int>._M_i;
    puVar7[2] = (uint8_t)uVar4;
    if (uVar4 < 0x80) {
      puVar7 = puVar7 + 3;
    }
    else {
      puVar7 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper
                         (uVar4,puVar7 + 2);
    }
    puVar7 = Int64Vector::_InternalSerialize(this_01,puVar7,stream);
  }
  uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar3 & 1) != 0) {
    uVar3 = uVar3 & 0xfffffffffffffffc;
    data = *(void **)(uVar3 + 8);
    size = (int)*(undefined8 *)(uVar3 + 0x10);
    __n = (size_t)size;
    if ((long)stream->end_ - (long)puVar7 < (long)__n) {
      puVar7 = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback(stream,data,size,puVar7);
      return puVar7;
    }
    memcpy(puVar7,data,__n);
    puVar7 = puVar7 + __n;
  }
  return puVar7;
}

Assistant:

uint8_t* TreeEnsembleClassifier::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.TreeEnsembleClassifier)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.TreeEnsembleParameters treeEnsemble = 1;
  if (this->_internal_has_treeensemble()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        1, _Internal::treeensemble(this), target, stream);
  }

  // .CoreML.Specification.TreeEnsemblePostEvaluationTransform postEvaluationTransform = 2;
  if (this->_internal_postevaluationtransform() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteEnumToArray(
      2, this->_internal_postevaluationtransform(), target);
  }

  // .CoreML.Specification.StringVector stringClassLabels = 100;
  if (_internal_has_stringclasslabels()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        100, _Internal::stringclasslabels(this), target, stream);
  }

  // .CoreML.Specification.Int64Vector int64ClassLabels = 101;
  if (_internal_has_int64classlabels()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        101, _Internal::int64classlabels(this), target, stream);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.TreeEnsembleClassifier)
  return target;
}